

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O3

void gen_mtvsrd(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  long lVar1;
  TCGTemp *a1;
  uintptr_t o;
  uint32_t excp;
  uint uVar2;
  uintptr_t o_1;
  
  s = ctx->uc->tcg_ctx;
  if ((ctx->opcode & 1) == 0) {
    if (ctx->fpu_enabled != false) {
LAB_00bb7018:
      a1 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
      uVar2 = ctx->opcode;
      lVar1 = *(long *)((long)cpu_gpr + (ulong)(uVar2 >> 0xd & 0xf8));
      if (lVar1 != (long)a1 - (long)s) {
        tcg_gen_op2_ppc64(s,INDEX_op_mov_i64,(TCGArg)a1,(long)&s->pool_cur + lVar1);
        uVar2 = ctx->opcode;
      }
      tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)a1,(TCGArg)(s->cpu_env + (long)s),
                        (ulong)((uVar2 >> 0x15 & 0x1f | (uVar2 & 1) << 5) * 0x10 + 0x12b28));
      tcg_temp_free_internal_ppc64(s,(TCGTemp *)(((long)a1 - (long)s) + (long)s));
      return;
    }
    excp = 7;
  }
  else {
    if (ctx->altivec_enabled != false) goto LAB_00bb7018;
    excp = 0x49;
  }
  gen_exception(ctx,excp);
  return;
}

Assistant:

static void gen_mtvsrd(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i64 t0;
    if (xS(ctx->opcode) < 32) {
        if (unlikely(!ctx->fpu_enabled)) {
            gen_exception(ctx, POWERPC_EXCP_FPU);
            return;
        }
    } else {
        if (unlikely(!ctx->altivec_enabled)) {
            gen_exception(ctx, POWERPC_EXCP_VPU);
            return;
        }
    }
    t0 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_mov_i64(tcg_ctx, t0, cpu_gpr[rA(ctx->opcode)]);
    set_cpu_vsrh(tcg_ctx, xT(ctx->opcode), t0);
    tcg_temp_free_i64(tcg_ctx, t0);
}